

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool duckdb::HugeIntegerCastOperation::
     HandleDecimal<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true,true>
               (HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *state,
               uint8_t digit)

{
  bool bVar1;
  uhugeint_t uVar2;
  uhugeint_t local_58;
  uhugeint_t local_48;
  uhugeint_t local_38;
  
  bVar1 = HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long>::Flush(state);
  if (bVar1) {
    uhugeint_t::uhugeint_t(&local_58,((ulong)digit ^ 0x7ffffffffffffffe) / 10);
    bVar1 = uhugeint_t::operator>(&state->decimal_intermediate,&local_58);
    if (bVar1) {
      bVar1 = HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long>::FlushDecimal
                        (state);
      if (!bVar1) goto LAB_00d80eff;
    }
    uhugeint_t::uhugeint_t(&local_38,10);
    local_58 = uhugeint_t::operator*(&state->decimal_intermediate,&local_38);
    uhugeint_t::uhugeint_t(&local_48,(ulong)digit);
    uVar2 = uhugeint_t::operator+(&local_58,&local_48);
    (state->decimal_intermediate).lower = uVar2.lower;
    (state->decimal_intermediate).upper = uVar2.upper;
    state->decimal_intermediate_digits = state->decimal_intermediate_digits + 1;
    bVar1 = true;
  }
  else {
LAB_00d80eff:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool HandleDecimal(T &state, uint8_t digit) {
		if (!state.Flush()) {
			return false;
		}
		if (DUCKDB_UNLIKELY(state.decimal_intermediate > (NumericLimits<int64_t>::Maximum() - digit) / 10)) {
			if (!state.FlushDecimal()) {
				return false;
			}
		}
		state.decimal_intermediate = state.decimal_intermediate * 10 + digit;
		state.decimal_intermediate_digits++;
		return true;
	}